

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlFAGenerateEpsilonTransition(xmlRegParserCtxtPtr ctxt,xmlRegStatePtr from,xmlRegStatePtr to)

{
  xmlRegStatePtr local_28;
  xmlRegStatePtr to_local;
  xmlRegStatePtr from_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  local_28 = to;
  if (to == (xmlRegStatePtr)0x0) {
    local_28 = xmlRegStatePush(ctxt);
    if (local_28 == (xmlRegStatePtr)0x0) {
      return -1;
    }
    ctxt->state = local_28;
  }
  xmlRegStateAddTrans(ctxt,from,(xmlRegAtomPtr)0x0,local_28,-1,-1);
  return 0;
}

Assistant:

static int
xmlFAGenerateEpsilonTransition(xmlRegParserCtxtPtr ctxt,
			       xmlRegStatePtr from, xmlRegStatePtr to) {
    if (to == NULL) {
	to = xmlRegStatePush(ctxt);
        if (to == NULL)
            return(-1);
	ctxt->state = to;
    }
    xmlRegStateAddTrans(ctxt, from, NULL, to, -1, -1);
    return(0);
}